

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_solver.c
# Opt level: O1

cupdlp_retcode PDHG_Solve(CUPDLPwork *pdhg)

{
  int iVar1;
  CUPDLPproblem *pCVar2;
  CUPDLPsettings *pCVar3;
  CUPDLPresobj *pCVar4;
  CUPDLPiterates *pCVar5;
  CUPDLPtimers *pCVar6;
  CUPDLPscaling *pCVar7;
  CUPDLPtimers *pCVar8;
  CUPDLPvec *pCVar9;
  CUPDLPvec *pCVar10;
  CUPDLPvec *pCVar11;
  byte bVar12;
  cupdlp_bool cVar13;
  cupdlp_retcode cVar14;
  termination_code tVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  char *pcVar19;
  bool bVar20;
  long lVar21;
  bool bVar22;
  double dVar23;
  long local_68;
  long local_60;
  long local_58;
  
  pCVar2 = pdhg->problem;
  pCVar3 = pdhg->settings;
  pCVar4 = pdhg->resobj;
  pCVar5 = pdhg->iterates;
  pCVar6 = pdhg->timers;
  pCVar7 = pdhg->scaling;
  pCVar6->nIter = 0;
  dVar23 = getTimeStamp();
  pCVar6->dSolvingBeg = dVar23;
  PDHG_Init_Data(pdhg);
  cVar14 = PDHG_Init_Step_Sizes(pdhg);
  if (cVar14 != 0) {
    return 1;
  }
  PDHG_Init_Variables(pdhg);
  pCVar6->nIter = 0;
  if (0 < pCVar3->nIterLim) {
    iVar1 = 0x32;
    do {
      pCVar8 = pdhg->timers;
      dVar23 = getTimeStamp();
      pCVar8->dSolvingTime = dVar23 - pCVar8->dSolvingBeg;
      iVar16 = pCVar6->nIter;
      bVar22 = true;
      if (((9 < iVar16) && (iVar16 != pCVar3->nIterLim + -1)) &&
         (pCVar6->dSolvingTime < pCVar3->dTimeLim || pCVar6->dSolvingTime == pCVar3->dTimeLim)) {
        bVar22 = ((uint)(iVar16 * -0x33333333) >> 3 | iVar16 * -0x60000000) < 0x6666667;
      }
      if ((bVar22) && (iVar16 % (pCVar3->nLogInterval * 0x28) == 0)) {
        bVar20 = true;
      }
      else {
        bVar20 = true;
        if (iVar16 != pCVar3->nIterLim + -1) {
          bVar20 = pCVar3->dTimeLim <= pCVar6->dSolvingTime &&
                   pCVar6->dSolvingTime != pCVar3->dTimeLim;
        }
      }
      if (bVar22) {
        iVar16 = pdhg->settings->nLogLevel;
        PDHG_Compute_Average_Iterate(pdhg);
        PDHG_Compute_Residuals(pdhg);
        PDHG_Compute_Infeas_Residuals(pdhg);
        if ((0 < iVar16 & bVar20) == 1) {
          if ((1 < iVar16) || (iVar1 == 0x32)) {
            iVar1 = 0;
            printf("%9s  %15s  %15s   %8s  %10s  %8s %7s\n","Iter","Primal.Obj","Dual.Obj","Gap",
                   "Primal.Inf","Dual.Inf","Time");
          }
          if (1 < iVar16) {
            PDHG_Print_Iter(pdhg);
          }
          PDHG_Print_Iter_Average(pdhg);
          iVar1 = iVar1 + 1;
        }
        bVar12 = 1 < iVar16 & bVar20;
        cVar13 = PDHG_Check_Termination(pdhg,(uint)bVar12);
        if (cVar13) {
          pCVar4->termCode = OPTIMAL;
          pCVar4->termIterate = LAST_ITERATE;
LAB_0038dc4b:
          iVar16 = 3;
          bVar22 = false;
        }
        else {
          if ((pdhg->settings->iInfNormAbsLocalTermination == 0) &&
             (cVar13 = PDHG_Check_Termination_Average(pdhg,(uint)bVar12), cVar13)) {
            iVar16 = pdhg->timers->nIter % 2;
            pCVar9 = pCVar5->y[iVar16];
            pCVar10 = pCVar5->ax[iVar16];
            pCVar11 = pCVar5->aty[iVar16];
            memcpy(pCVar5->x[iVar16]->data,pCVar5->xAverage->data,(long)pCVar2->nCols << 3);
            memcpy(pCVar9->data,pCVar5->yAverage->data,(long)pCVar2->nRows << 3);
            memcpy(pCVar10->data,pCVar5->axAverage->data,(long)pCVar2->nRows << 3);
            memcpy(pCVar11->data,pCVar5->atyAverage->data,(long)pCVar2->nCols << 3);
            memcpy(pCVar4->dSlackPos,pCVar4->dSlackPosAverage,(long)pCVar2->nCols << 3);
            memcpy(pCVar4->dSlackNeg,pCVar4->dSlackNegAverage,(long)pCVar2->nCols << 3);
            pCVar4->termCode = OPTIMAL;
            pCVar4->termIterate = AVERAGE_ITERATE;
            goto LAB_0038dc4b;
          }
          tVar15 = PDHG_Check_Infeasibility(pdhg,0);
          if (tVar15 == INFEASIBLE_OR_UNBOUNDED) {
            pCVar4->termCode = INFEASIBLE_OR_UNBOUNDED;
            goto LAB_0038dc4b;
          }
          if ((pCVar3->dTimeLim <= pCVar6->dSolvingTime && pCVar6->dSolvingTime != pCVar3->dTimeLim)
             || (pCVar3->nIterLim + -1 <= pCVar6->nIter)) {
            pCVar4->termCode = TIMELIMIT_OR_ITERLIMIT;
            iVar16 = 3;
            bVar22 = false;
          }
          else {
            PDHG_Restart_Iterate(pdhg);
            iVar16 = 0;
            bVar22 = true;
          }
        }
        if (bVar22) goto LAB_0038dc5b;
      }
      else {
LAB_0038dc5b:
        cVar14 = PDHG_Update_Iterate(pdhg);
        iVar16 = 0;
        if (cVar14 == 1) {
          pCVar4->termCode = TIMELIMIT_OR_ITERLIMIT;
          iVar16 = 3;
        }
      }
    } while ((iVar16 == 0) &&
            (iVar16 = pCVar6->nIter + 1, pCVar6->nIter = iVar16, iVar16 < pCVar3->nIterLim));
  }
  iVar1 = pdhg->settings->nLogLevel;
  if (0 < iVar1) {
    if (iVar1 != 1) {
      printf("%9s  %15s  %15s   %8s  %10s  %8s %7s\n","Iter","Primal.Obj","Dual.Obj","Gap",
             "Primal.Inf","Dual.Inf","Time");
      PDHG_Print_Iter(pdhg);
    }
    PDHG_Print_Iter_Average(pdhg);
  }
  if (pdhg->settings->nLogLevel < 1) goto LAB_0038dfb0;
  putchar(10);
  printf("%-27s ","Solving information:");
  tVar15 = pCVar4->termCode;
  if (tVar15 == TIMELIMIT_OR_ITERLIMIT) {
    if (pCVar3->dTimeLim <= pCVar6->dSolvingTime && pCVar6->dSolvingTime != pCVar3->dTimeLim) {
      pcVar19 = "Time limit reached.";
      goto LAB_0038de40;
    }
    if (pCVar3->nIterLim + -1 <= pCVar6->nIter) {
      pcVar19 = "Iteration limit reached.";
      goto LAB_0038de40;
    }
  }
  else {
    if (tVar15 == INFEASIBLE_OR_UNBOUNDED) {
      if (pCVar4->primalCode == FEASIBLE) {
        if (pCVar4->dualCode != INFEASIBLE) goto LAB_0038de13;
        pcVar19 = "Infeasible or unbounded: dual infeasible.";
      }
      else if ((pCVar4->primalCode == INFEASIBLE) && (pCVar4->dualCode == FEASIBLE)) {
        pcVar19 = "Infeasible or unbounded: primal infeasible.";
      }
      else {
LAB_0038de13:
        pcVar19 = "Infeasible or unbounded: both primal and dual infeasible.";
      }
      printf(pcVar19);
      if (pCVar4->termInfeasIterate == LAST_ITERATE) {
        pcVar19 = " [L]";
      }
      else {
        if (pCVar4->termInfeasIterate != AVERAGE_ITERATE) goto LAB_0038de45;
        pcVar19 = " [A]";
      }
    }
    else if (tVar15 == OPTIMAL) {
      if (pCVar4->termIterate == LAST_ITERATE) {
        pcVar19 = "Optimal current solution.";
      }
      else {
        if (pCVar4->termIterate != AVERAGE_ITERATE) goto LAB_0038de45;
        pcVar19 = "Optimal average solution.";
      }
    }
    else {
      pcVar19 = "Unexpected.";
    }
LAB_0038de40:
    puts(pcVar19);
  }
LAB_0038de45:
  if ((pCVar4->termCode == OPTIMAL) && (pCVar4->termIterate == AVERAGE_ITERATE)) {
    local_68 = 0x138;
    local_58 = 0x118;
    local_60 = 0x130;
    lVar18 = 0x128;
    lVar21 = 0x110;
    lVar17 = 0x108;
  }
  else {
    local_68 = 0x38;
    local_58 = 0x18;
    local_60 = 0x30;
    lVar18 = 0x28;
    lVar21 = 0x10;
    lVar17 = 8;
  }
  printf("%27s %+15.8e\n",*(undefined8 *)((long)&pCVar4->dFeasTol + lVar17),"Primal objective:");
  printf("%27s %+15.8e\n",*(undefined8 *)((long)&pCVar4->dFeasTol + lVar21),"Dual objective:");
  dVar23 = *(double *)((long)&pCVar4->dFeasTol + lVar18);
  printf("%27s %8.2e / %8.2e\n",dVar23,dVar23 / (pCVar7->dNormRhs + 1.0),"Primal infeas (abs/rel):")
  ;
  dVar23 = *(double *)((long)&pCVar4->dFeasTol + local_60);
  printf("%27s %8.2e / %8.2e\n",dVar23,dVar23 / (pCVar7->dNormCost + 1.0),"Dual infeas (abs/rel):");
  printf("%27s %8.2e / %8.2e\n",*(ulong *)((long)&pCVar4->dFeasTol + local_58) & 0x7fffffffffffffff,
         *(undefined8 *)((long)&pCVar4->dFeasTol + local_68),"Duality gap (abs/rel):");
  printf("%27s %d\n","Number of iterations:",(ulong)(uint)pCVar6->nIter);
  putchar(10);
LAB_0038dfb0:
  if (1 < pdhg->settings->nLogLevel) {
    puts("Timing information:");
    printf("%21s %e in %d iterations\n",
           pCVar6->dSolvingTime + pCVar6->dScalingTime + pCVar6->dPresolveTime,"Total solver time",
           (ulong)(uint)pCVar6->nIter);
    printf("%21s %e in %d iterations\n",pCVar6->dSolvingTime,"Solve time",(ulong)(uint)pCVar6->nIter
          );
    printf("%21s %e \n",(double)pCVar6->nIter / pCVar6->dSolvingTime,"Iters per sec");
    printf("%21s %e\n",pCVar6->dScalingTime,"Scaling time");
    printf("%21s %e\n",pCVar6->dPresolveTime,"Presolve time");
    printf("%21s %e in %d calls\n",pCVar6->dAxTime,"Ax",(ulong)(uint)pCVar6->nAxCalls);
    printf("%21s %e in %d calls\n",pCVar6->dAtyTime,"Aty",(ulong)(uint)pCVar6->nAtyCalls);
    printf("%21s %e in %d calls\n",pCVar6->dComputeResidualsTime,"ComputeResiduals",
           (ulong)(uint)pCVar6->nComputeResidualsCalls);
    printf("%21s %e in %d calls\n",pCVar6->dUpdateIterateTime,"UpdateIterates",
           (ulong)(uint)pCVar6->nUpdateIterateCalls);
  }
  return 0;
}

Assistant:

cupdlp_retcode PDHG_Solve(CUPDLPwork *pdhg) {
  cupdlp_retcode retcode = RETCODE_OK;

  CUPDLPproblem *problem = pdhg->problem;
  CUPDLPstepsize *stepsize = pdhg->stepsize;
  CUPDLPsettings *settings = pdhg->settings;
  CUPDLPresobj *resobj = pdhg->resobj;
  CUPDLPiterates *iterates = pdhg->iterates;
  CUPDLPtimers *timers = pdhg->timers;
  CUPDLPscaling *scaling = pdhg->scaling;

  timers->nIter = 0;
  timers->dSolvingBeg = getTimeStamp();

  PDHG_Init_Data(pdhg);

  CUPDLP_CALL(PDHG_Init_Step_Sizes(pdhg));

  PDHG_Init_Variables(pdhg);

  // todo: translate check_data into cuda or do it on cpu
  // PDHG_Check_Data(pdhg);

  // PDHG_Print_Header(pdhg);

  // Repeat the iteration logging header periodically if logging style
  // is minimal (pdhg->settings->nLogLevel=1), initialising
  // iter_log_since_header so that an initial header is printed
  const int iter_log_between_header = 50;
  int iter_log_since_header = iter_log_between_header;
  for (timers->nIter = 0; timers->nIter < settings->nIterLim; ++timers->nIter) {
    PDHG_Compute_SolvingTime(pdhg);
#if CUPDLP_DUMP_ITERATES_STATS && CUPDLP_DEBUG
    PDHG_Dump_Stats(pdhg);
#endif
    int bool_checking = (timers->nIter < 10) ||
                        (timers->nIter == (settings->nIterLim - 1)) ||
                        (timers->dSolvingTime > settings->dTimeLim);
    int bool_print = 0;
#if CUPDLP_DEBUG
    bool_checking = (bool_checking || !(timers->nIter % CUPDLP_DEBUG_INTERVAL));
    bool_print = bool_checking;
#else
    bool_checking =
        (bool_checking || !(timers->nIter % CUPDLP_RELEASE_INTERVAL));
    bool_print =
        (bool_checking && !(timers->nIter % (CUPDLP_RELEASE_INTERVAL *
                                             settings->nLogInterval))) ||
        (timers->nIter == (settings->nIterLim - 1)) ||
        (timers->dSolvingTime > settings->dTimeLim);
    // Ensure that bool_print is false if the logging level has been
    // set to 0 via the HiGHS option
    bool_print = pdhg->settings->nLogLevel>0 && bool_print;
#endif
    // Full printing is false only if the logging level has been set
    // to 0 or 1 via the HiGHS option
    int full_print = pdhg->settings->nLogLevel >= 2;
    if (bool_checking) {
      PDHG_Compute_Average_Iterate(pdhg);
      PDHG_Compute_Residuals(pdhg);
      PDHG_Compute_Infeas_Residuals(pdhg);

      if (bool_print) {
	// With reduced printing, the header is only needed for the
	// first iteration since only average iteration printing is
	// carried out
        if (full_print ||
	    iter_log_since_header == iter_log_between_header) {
	  PDHG_Print_Header(pdhg);
	  iter_log_since_header = 0;
	}
        if (full_print) PDHG_Print_Iter(pdhg);
        PDHG_Print_Iter_Average(pdhg);
	iter_log_since_header++;
      }

      // Termination check printing is only done when printing is full
      int termination_print = bool_print && full_print;
      if (PDHG_Check_Termination(pdhg, termination_print)) {
        // cupdlp_printf("Optimal current solution.\n");
        resobj->termIterate = LAST_ITERATE;
        resobj->termCode = OPTIMAL;
        break;
      }

      // Don't allow "average" termination if
      // iInfNormAbsLocalTermination is set
      if (!pdhg->settings->iInfNormAbsLocalTermination &&
	  PDHG_Check_Termination_Average(pdhg, termination_print)) {
	// cupdlp_printf("Optimal average solution.\n");
	
    cupdlp_int iter = pdhg->timers->nIter;
    CUPDLPvec *x = iterates->x[iter % 2];
    CUPDLPvec *y = iterates->y[iter % 2];
    CUPDLPvec *ax = iterates->ax[iter % 2];
    CUPDLPvec *aty = iterates->aty[iter % 2];

    CUPDLP_COPY_VEC(x->data, iterates->xAverage->data, cupdlp_float, problem->nCols);
    CUPDLP_COPY_VEC(y->data, iterates->yAverage->data, cupdlp_float, problem->nRows);
    CUPDLP_COPY_VEC(ax->data, iterates->axAverage->data, cupdlp_float, problem->nRows);
    CUPDLP_COPY_VEC(aty->data, iterates->atyAverage->data, cupdlp_float, problem->nCols);
    CUPDLP_COPY_VEC(resobj->dSlackPos, resobj->dSlackPosAverage, cupdlp_float, problem->nCols);
    CUPDLP_COPY_VEC(resobj->dSlackNeg, resobj->dSlackNegAverage, cupdlp_float, problem->nCols);

	resobj->termIterate = AVERAGE_ITERATE;
	resobj->termCode = OPTIMAL;
	break;
      }

      if (PDHG_Check_Infeasibility(pdhg, 0) == INFEASIBLE_OR_UNBOUNDED) {
        // cupdlp_printf("Infeasible or unbounded.\n");
        // if (resobj->primalCode == INFEASIBLE && resobj->dualCode == FEASIBLE)
        // {
        //   resobj->dualCode = UNBOUNDED;
        // } else if (resobj->primalCode == FEASIBLE &&
        //            resobj->dualCode == INFEASIBLE) {
        //   resobj->primalCode = UNBOUNDED;
        // }
        // resobj->termCode = resobj->primalCode;
        resobj->termCode = INFEASIBLE_OR_UNBOUNDED;
        break;
      }

      if (timers->dSolvingTime > settings->dTimeLim) {
        // cupdlp_printf("Time limit reached.\n");
        resobj->termCode = TIMELIMIT_OR_ITERLIMIT;
        break;
      }

      if (timers->nIter >= (settings->nIterLim - 1)) {
        // cupdlp_printf("Iteration limit reached.\n");
        resobj->termCode = TIMELIMIT_OR_ITERLIMIT;
        break;
      }

      PDHG_Restart_Iterate(pdhg);
    }

    // CUPDLP_CALL(PDHG_Update_Iterate(pdhg));
    if (PDHG_Update_Iterate(pdhg) == RETCODE_FAILED) {
      // cupdlp_printf("Time limit reached.\n");
      resobj->termCode = TIMELIMIT_OR_ITERLIMIT;
      break;
    }
  }

  // print at last
  if (pdhg->settings->nLogLevel>0) {
    int full_print = pdhg->settings->nLogLevel >= 2;
    if (full_print) {
      PDHG_Print_Header(pdhg);
      PDHG_Print_Iter(pdhg);
    }
    PDHG_Print_Iter_Average(pdhg);
  }

  if (pdhg->settings->nLogLevel>0) {
    cupdlp_printf("\n");
    cupdlp_printf("%-27s ", "Solving information:");

    switch (resobj->termCode) {
    case OPTIMAL:
      if (resobj->termIterate == LAST_ITERATE) {
        cupdlp_printf("Optimal current solution.\n");
      } else if (resobj->termIterate == AVERAGE_ITERATE) {
        cupdlp_printf("Optimal average solution.\n");
      }
      break;
    case TIMELIMIT_OR_ITERLIMIT:
      if (timers->dSolvingTime > settings->dTimeLim) {
        cupdlp_printf("Time limit reached.\n");
      } else if (timers->nIter >= (settings->nIterLim - 1)) {
        cupdlp_printf("Iteration limit reached.\n");
      }
      break;
    case INFEASIBLE_OR_UNBOUNDED:
      if (resobj->primalCode == INFEASIBLE && resobj->dualCode == FEASIBLE) {
        cupdlp_printf("Infeasible or unbounded: primal infeasible.");
      } else if (resobj->primalCode == FEASIBLE &&
                 resobj->dualCode == INFEASIBLE) {
        cupdlp_printf("Infeasible or unbounded: dual infeasible.");
      } else {
        cupdlp_printf(
		      "Infeasible or unbounded: both primal and dual infeasible.");
      }
      
      if (resobj->termInfeasIterate == LAST_ITERATE) {
        cupdlp_printf(" [L]\n");
      } else if (resobj->termInfeasIterate == AVERAGE_ITERATE) {
        cupdlp_printf(" [A]\n");
      }
      break;
    default:
      cupdlp_printf("Unexpected.\n");
      break;
    }

    if (resobj->termCode == OPTIMAL && resobj->termIterate == AVERAGE_ITERATE) {
      cupdlp_printf("%27s %+15.8e\n",
		    "Primal objective:", resobj->dPrimalObjAverage);
      cupdlp_printf("%27s %+15.8e\n", "Dual objective:", resobj->dDualObjAverage);
      cupdlp_printf("%27s %8.2e / %8.2e\n",
		    "Primal infeas (abs/rel):", resobj->dPrimalFeasAverage,
		    resobj->dPrimalFeasAverage / (1.0 + scaling->dNormRhs));
      cupdlp_printf("%27s %8.2e / %8.2e\n",
		    "Dual infeas (abs/rel):", resobj->dDualFeasAverage,
		    resobj->dDualFeasAverage / (1.0 + scaling->dNormCost));
      cupdlp_printf("%27s %8.2e / %8.2e\n",
		    "Duality gap (abs/rel):", fabs(resobj->dDualityGapAverage),
		    resobj->dRelObjGapAverage);
    } else {
      cupdlp_printf("%27s %+15.8e\n", "Primal objective:", resobj->dPrimalObj);
      cupdlp_printf("%27s %+15.8e\n", "Dual objective:", resobj->dDualObj);
      cupdlp_printf("%27s %8.2e / %8.2e\n",
		    "Primal infeas (abs/rel):", resobj->dPrimalFeas,
		    resobj->dPrimalFeas / (1.0 + scaling->dNormRhs));
      cupdlp_printf("%27s %8.2e / %8.2e\n",
		    "Dual infeas (abs/rel):", resobj->dDualFeas,
		    resobj->dDualFeas / (1.0 + scaling->dNormCost));
      cupdlp_printf("%27s %8.2e / %8.2e\n",
		    "Duality gap (abs/rel):", fabs(resobj->dDualityGap),
		    resobj->dRelObjGap);
    }
    cupdlp_printf("%27s %d\n", "Number of iterations:", timers->nIter);
    cupdlp_printf("\n");
  }

#if PDHG_USE_TIMERS
  if (pdhg->settings->nLogLevel>1) {
    cupdlp_printf("Timing information:\n");
    // cupdlp_printf("%21s %e in %d iterations\n", "Total solver time",
    //               timers->dSolvingTime, timers->nIter);
    cupdlp_printf(
		  "%21s %e in %d iterations\n", "Total solver time",
		  timers->dSolvingTime + timers->dScalingTime + timers->dPresolveTime,
		  timers->nIter);
    cupdlp_printf("%21s %e in %d iterations\n", "Solve time",
		  timers->dSolvingTime, timers->nIter);
    cupdlp_printf("%21s %e \n", "Iters per sec",
		  timers->nIter / timers->dSolvingTime);
    cupdlp_printf("%21s %e\n", "Scaling time", timers->dScalingTime);
    cupdlp_printf("%21s %e\n", "Presolve time", timers->dPresolveTime);
    cupdlp_printf("%21s %e in %d calls\n", "Ax", timers->dAxTime,
		  timers->nAxCalls);
    cupdlp_printf("%21s %e in %d calls\n", "Aty", timers->dAtyTime,
		  timers->nAtyCalls);
    cupdlp_printf("%21s %e in %d calls\n", "ComputeResiduals",
		  timers->dComputeResidualsTime, timers->nComputeResidualsCalls);
    cupdlp_printf("%21s %e in %d calls\n", "UpdateIterates",
		  timers->dUpdateIterateTime, timers->nUpdateIterateCalls);
  }
#endif

#ifndef CUPDLP_CPU
  if (pdhg->settings->nLogLevel>0) {
    cupdlp_printf("\n");
    cupdlp_printf("GPU Timing information:\n");
    cupdlp_printf("%21s %e\n", "CudaPrepare", timers->CudaPrepareTime);
    cupdlp_printf("%21s %e\n", "Alloc&CopyMatToDevice",
		  timers->AllocMem_CopyMatToDeviceTime);
    cupdlp_printf("%21s %e\n", "CopyVecToDevice", timers->CopyVecToDeviceTime);
    cupdlp_printf("%21s %e\n", "DeviceMatVecProd", timers->DeviceMatVecProdTime);
    cupdlp_printf("%21s %e\n\n", "CopyVecToHost", timers->CopyVecToHostTime);
  }
#endif

exit_cleanup:
  return retcode;
}